

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMaxUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *param_3,
          bool updateOverlaps)

{
  uint *puVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  Handle *pHVar6;
  Handle *pHVar7;
  btOverlappingPairCallback *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint axis0;
  Handle *pHVar12;
  Handle *pHVar13;
  Edge *pEVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  
  lVar10 = (long)axis;
  pEVar14 = this->m_pEdges[lVar10] + edge;
  uVar4 = pEVar14->m_handle;
  pHVar6 = this->m_pHandles;
  axis0 = 1 << ((byte)axis & 0x1f) & 3;
  lVar9 = 0x3c;
  for (; (uVar5 = pEVar14[1].m_handle, (ulong)uVar5 != 0 && (pEVar14[1].m_pos <= pEVar14->m_pos));
      pEVar14 = pEVar14 + 1) {
    pHVar7 = this->m_pHandles;
    bVar15 = (pEVar14[1].m_pos & 1) == 0;
    lVar11 = 0x48;
    if (bVar15) {
      lVar11 = lVar9;
    }
    if (bVar15 && updateOverlaps) {
      bVar15 = testOverlap2D(this,pHVar6 + uVar4,pHVar7 + uVar5,axis0,1 << (sbyte)axis0 & 3);
      lVar11 = lVar9;
      if (bVar15) {
        pHVar12 = this->m_pHandles + pEVar14->m_handle;
        pHVar13 = this->m_pHandles + pEVar14[1].m_handle;
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar12,pHVar13);
        pbVar8 = this->m_userPairCallback;
        if (pbVar8 != (btOverlappingPairCallback *)0x0) {
          (*pbVar8->_vptr_btOverlappingPairCallback[2])(pbVar8,pHVar12,pHVar13);
        }
      }
    }
    piVar2 = (int *)((long)pHVar7[uVar5].super_btBroadphaseProxy.m_aabbMin.m_floats +
                    lVar10 * 4 + lVar11 + -0x1c);
    *piVar2 = *piVar2 + -1;
    puVar1 = pHVar6[uVar4].m_maxEdges + lVar10;
    *puVar1 = *puVar1 + 1;
    auVar3 = *(undefined1 (*) [16])pEVar14;
    auVar16._0_8_ = auVar3._8_8_;
    auVar16._8_4_ = auVar3._0_4_;
    auVar16._12_4_ = auVar3._4_4_;
    *(undefined1 (*) [16])pEVar14 = auVar16;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}